

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_std_suite.cpp
# Opt level: O0

void compact_array_suite::test_int16(void)

{
  reference pvVar1;
  undefined4 local_f8 [2];
  undefined4 local_f0 [2];
  undefined4 local_e8 [2];
  undefined4 local_e0 [4];
  char *msg;
  array<short,_4UL> local_c0;
  array<short,_4UL> value;
  iarchive in;
  value_type input [10];
  
  in.reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x13031202110108aa;
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[10]>
            ((iarchive *)&value,
             (uchar (*) [10])
             ((long)&in.reader.stack.c.
                     super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                     ._M_impl.super__Deque_impl_data + 0x48));
  local_c0._M_elems[0] = 0x7fff;
  local_c0._M_elems[1] = 0x7fff;
  local_c0._M_elems[2] = 0x7fff;
  local_c0._M_elems[3] = 0x7fff;
  boost::archive::detail::interface_iarchive<trial::protocol::bintoken::iarchive>::operator>>
            ((interface_iarchive<trial::protocol::bintoken::iarchive> *)&value,&local_c0);
  pvVar1 = std::array<short,_4UL>::operator[](&local_c0,0);
  local_e0[0] = 0x1101;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,int>
            ("value[0]","INT16_C(0x1101)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x79,"void compact_array_suite::test_int16()",pvVar1,local_e0);
  pvVar1 = std::array<short,_4UL>::operator[](&local_c0,1);
  local_e8[0] = 0x1202;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,int>
            ("value[1]","INT16_C(0x1202)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x7a,"void compact_array_suite::test_int16()",pvVar1,local_e8);
  pvVar1 = std::array<short,_4UL>::operator[](&local_c0,2);
  local_f0[0] = 0x1303;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,int>
            ("value[2]","INT16_C(0x1303)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x7b,"void compact_array_suite::test_int16()",pvVar1,local_f0);
  pvVar1 = std::array<short,_4UL>::operator[](&local_c0,3);
  local_f8[0] = 0x1404;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,int>
            ("value[3]","INT16_C(0x1404)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x7c,"void compact_array_suite::test_int16()",pvVar1,local_f8);
  trial::protocol::bintoken::iarchive::~iarchive((iarchive *)&value);
  return;
}

Assistant:

void test_int16()
{
    const value_type input[] = { token::code::array8_int16, 4 * token::int16::size,
                                 0x01, 0x11,
                                 0x02, 0x12,
                                 0x03, 0x13,
                                 0x04, 0x14 };
    format::iarchive in(input);
    std::array<std::int16_t, 4> value = {{ std::numeric_limits<std::int16_t>::max(),
                                           std::numeric_limits<std::int16_t>::max(),
                                           std::numeric_limits<std::int16_t>::max(),
                                           std::numeric_limits<std::int16_t>::max() }};
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value[0], INT16_C(0x1101));
    TRIAL_PROTOCOL_TEST_EQUAL(value[1], INT16_C(0x1202));
    TRIAL_PROTOCOL_TEST_EQUAL(value[2], INT16_C(0x1303));
    TRIAL_PROTOCOL_TEST_EQUAL(value[3], INT16_C(0x1404));
}